

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpExtensions.cpp
# Opt level: O0

void __thiscall
GrpTokenStreamFilter::ReportLexerError(GrpTokenStreamFilter *this,ScannerException *ex)

{
  GrpLineAndFile *in_RSI;
  string *in_RDI;
  int unaff_retaddr;
  undefined1 unaff_retaddr_00;
  int nLineOrig;
  int nLinePre;
  int in_stack_ffffffffffffff68;
  int nPre;
  int iVar1;
  undefined4 in_stack_ffffffffffffff74;
  string local_80 [72];
  string local_38 [32];
  int local_18;
  int local_14;
  string *msg;
  
  msg = in_RDI;
  local_14 = (**(code **)(*(long *)in_RSI + 0x30))();
  local_18 = local_14 + *(int *)(in_RDI + 0x30);
  (**(code **)(*(long *)in_RSI + 0x28))(local_38);
  nPre = local_14;
  iVar1 = local_18;
  std::__cxx11::string::string(local_80,(string *)(in_RDI + 0x10));
  GrpLineAndFile::GrpLineAndFile
            ((GrpLineAndFile *)CONCAT44(in_stack_ffffffffffffff74,iVar1),nPre,
             in_stack_ffffffffffffff68,in_RDI);
  AddGlobalError((bool)unaff_retaddr_00,unaff_retaddr,msg,in_RSI);
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1dff13);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void GrpTokenStreamFilter::ReportLexerError(const ScannerException & ex)
{
	int nLinePre = ex.getLine();
	int nLineOrig = nLinePre + m_nLineOffset;
	AddGlobalError(true, 101, ex.getErrorMessage(), GrpLineAndFile(nLinePre, nLineOrig, m_staFile));
}